

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::mousePressEvent(QGraphicsItem *this,QGraphicsSceneMouseEvent *event)

{
  ulong uVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsScene *this_00;
  char cVar3;
  MouseButton MVar4;
  KeyboardModifiers KVar5;
  WindowFlags WVar6;
  QGraphicsItem *this_01;
  int __fd;
  long in_FS_OFFSET;
  QPointF local_58;
  QPointF local_48;
  QSizeF local_38;
  long local_20;
  
  __fd = (int)&local_58;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  MVar4 = QGraphicsSceneMouseEvent::button(event);
  uVar1 = *(ulong *)&((this->d_ptr).d)->field_0x160;
  if ((MVar4 == LeftButton) && ((uVar1 & 0x200000000) != 0)) {
    KVar5 = QGraphicsSceneMouseEvent::modifiers(event);
    if ((((uint)KVar5.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                super_QFlagsStorage<Qt::KeyboardModifier>.i >> 0x1a & 1) == 0) &&
       (pQVar2 = (this->d_ptr).d, (pQVar2->field_0x161 & 2) == 0)) {
      this_00 = (QGraphicsScene *)pQVar2->scene;
      if (this_00 != (QGraphicsScene *)0x0) {
        *(int *)(*(long *)(this_00 + 8) + 0x120) = *(int *)(*(long *)(this_00 + 8) + 0x120) + 1;
        QGraphicsScene::clearSelection(this_00);
        *(int *)(*(long *)(this_00 + 8) + 0x120) = *(int *)(*(long *)(this_00 + 8) + 0x120) + -1;
      }
      setSelected(this,true);
    }
  }
  else if ((uVar1 >> 0x20 & 1) == 0) {
    (event->super_QGraphicsSceneEvent).field_0xc = 0;
  }
  if ((((this->d_ptr).d)->field_0x163 & 1) != 0) {
    this_01 = this + -1;
    WVar6 = QGraphicsWidget::windowFlags((QGraphicsWidget *)this_01);
    if ((~(uint)WVar6.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i & 9) == 0) {
      (event->super_QGraphicsSceneEvent).field_0xc = 1;
      local_38 = QGraphicsWidget::size((QGraphicsWidget *)this_01);
      local_48.xp = 0.0;
      local_48.yp = 0.0;
      local_58 = QGraphicsSceneMouseEvent::pos(event);
      cVar3 = QRectF::contains(&local_48);
      if (cVar3 == '\0') {
        QGraphicsWidget::close((QGraphicsWidget *)this_01,__fd);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::mousePressEvent(QGraphicsSceneMouseEvent *event)
{
    if (event->button() == Qt::LeftButton && (flags() & ItemIsSelectable)) {
        bool multiSelect = (event->modifiers() & Qt::ControlModifier) != 0;
        if (!multiSelect) {
            if (!d_ptr->selected) {
                if (QGraphicsScene *scene = d_ptr->scene) {
                    ++scene->d_func()->selectionChanging;
                    scene->clearSelection();
                    --scene->d_func()->selectionChanging;
                }
                setSelected(true);
            }
        }
    } else if (!(flags() & ItemIsMovable)) {
        event->ignore();
    }
    if (d_ptr->isWidget) {
        // Qt::Popup closes when you click outside.
        QGraphicsWidget *w = static_cast<QGraphicsWidget *>(this);
        if ((w->windowFlags() & Qt::Popup) == Qt::Popup) {
            event->accept();
            if (!w->rect().contains(event->pos()))
                w->close();
        }
    }
}